

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O2

bool tinyusdz::tydra::GetBoundMaterial
               (Stage *_stage,Path *abs_path,string *materialPurpose,Path *materialPath,
               Material **material,string *err)

{
  Material *pMVar1;
  string *purpose_00;
  Token *purpose;
  Prim *prim_00;
  int iVar2;
  bool bVar3;
  Prim *prim;
  Material *directMaterial;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> purposes;
  string _err;
  Path parentPath;
  Path boundMaterialPath;
  Path currentPath;
  bool local_33c;
  Material *local_330;
  Stage *local_328;
  Material *local_320;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_318;
  Path *local_300;
  Material **local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  Prim *local_2e0;
  Path *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  string local_2c0;
  Path local_2a0;
  Path local_1d0;
  Path local_100;
  
  if (material == (Material **)0x0 || materialPath == (Path *)0x0) {
    local_33c = false;
  }
  else {
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_300 = materialPath;
    local_2f8 = material;
    local_2d8 = abs_path;
    if (materialPurpose->_M_string_length == 0) {
      Token::Token((Token *)&local_100,"");
    }
    else {
      Token::Token((Token *)&local_100,materialPurpose);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
      emplace_back<tinyusdz::Token>(&local_318,(Token *)&local_100);
      ::std::__cxx11::string::_M_dispose();
      Token::Token((Token *)&local_100,"");
    }
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::emplace_back<tinyusdz::Token>
              (&local_318,(Token *)&local_100);
    ::std::__cxx11::string::_M_dispose();
    local_2e0 = (Prim *)local_318.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
    local_2e8 = &local_1d0._variant_part_str.field_2;
    local_2f0 = &local_1d0._element.field_2;
    local_2c8 = &local_2a0._variant_part_str.field_2;
    local_2d0 = &local_2a0._element.field_2;
    local_33c = false;
    prim_00 = (Prim *)local_318.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      if (prim_00 == local_2e0) {
        local_33c = false;
        break;
      }
      Path::Path(&local_100,local_2d8);
      local_1d0._prim_part._M_dataplus._M_p = (pointer)&local_1d0._prim_part.field_2;
      local_1d0._prim_part._M_string_length = 0;
      local_1d0._prim_part.field_2._M_local_buf[0] = '\0';
      local_1d0._prop_part._M_dataplus._M_p = (pointer)&local_1d0._prop_part.field_2;
      local_1d0._prop_part._M_string_length = 0;
      local_1d0._prop_part.field_2._M_local_buf[0] = '\0';
      local_1d0._variant_part._M_dataplus._M_p = (pointer)&local_1d0._variant_part.field_2;
      local_1d0._variant_part._M_string_length = 0;
      local_1d0._variant_part.field_2._M_local_buf[0] = '\0';
      local_1d0._variant_selection_part._M_dataplus._M_p =
           (pointer)&local_1d0._variant_selection_part.field_2;
      local_1d0._variant_selection_part._M_string_length = 0;
      local_1d0._variant_selection_part.field_2._M_local_buf[0] = '\0';
      local_1d0._variant_part_str._M_dataplus._M_p = (pointer)local_2e8;
      local_1d0._variant_part_str._M_string_length = 0;
      local_1d0._variant_part_str.field_2._M_local_buf[0] = '\0';
      local_1d0._element._M_dataplus._M_p = (pointer)local_2f0;
      local_1d0._element._M_string_length = 0;
      local_1d0._element.field_2._M_local_buf[0] = '\0';
      local_1d0._path_type.has_value_ = false;
      local_1d0._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      local_1d0._valid = false;
      iVar2 = 0x20000;
      local_330 = (Material *)0x0;
      do {
        bVar3 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (((bVar3) || (local_100._valid != true)) ||
           ((local_100._prim_part._M_string_length == 1 &&
            (*local_100._prim_part._M_dataplus._M_p == '/')))) break;
        local_328 = (Stage *)0x0;
        purpose_00 = err;
        bVar3 = Stage::find_prim_at_path(_stage,&local_100,(Prim **)&local_328,err);
        if (!bVar3) {
          local_33c = false;
LAB_0028c75d:
          bVar3 = false;
          goto LAB_0028c768;
        }
        if ((local_330 == (Material *)0x0) ||
           (bVar3 = DirectBindingStrongerThanDescendants
                              ((tydra *)_stage,local_328,prim_00,purpose_00), bVar3)) {
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          local_2c0._M_string_length = 0;
          local_2a0._prim_part._M_dataplus._M_p = (pointer)&local_2a0._prim_part.field_2;
          local_2a0._prim_part._M_string_length = 0;
          local_2a0._prim_part.field_2._M_local_buf[0] = '\0';
          local_2a0._prop_part._M_dataplus._M_p = (pointer)&local_2a0._prop_part.field_2;
          local_2a0._prop_part._M_string_length = 0;
          local_2a0._prop_part.field_2._M_local_buf[0] = '\0';
          local_2a0._variant_part._M_dataplus._M_p = (pointer)&local_2a0._variant_part.field_2;
          local_2a0._variant_part._M_string_length = 0;
          local_2a0._variant_part.field_2._M_local_buf[0] = '\0';
          local_2a0._variant_selection_part._M_dataplus._M_p =
               (pointer)&local_2a0._variant_selection_part.field_2;
          local_2a0._variant_selection_part._M_string_length = 0;
          local_2a0._variant_selection_part.field_2._M_local_buf[0] = '\0';
          local_2a0._variant_part_str._M_dataplus._M_p = (pointer)local_2c8;
          local_2a0._variant_part_str._M_string_length = 0;
          local_2a0._variant_part_str.field_2._M_local_buf[0] = '\0';
          local_2a0._element._M_dataplus._M_p = (pointer)local_2d0;
          local_2a0._element._M_string_length = 0;
          local_2c0.field_2._M_local_buf[0] = '\0';
          local_2a0._element.field_2._M_local_buf[0] = '\0';
          local_2a0._path_type.has_value_ = false;
          local_2a0._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_2a0._valid = false;
          local_320 = (Material *)0x0;
          bVar3 = GetDirectlyBoundMaterial
                            (_stage,(Prim *)local_328,(string *)prim_00,&local_2a0,&local_320,
                             &local_2c0);
          pMVar1 = local_320;
          if (local_320 == (Material *)0x0 || !bVar3) {
            bVar3 = local_2c0._M_string_length == 0;
            if (err != (string *)0x0 && !bVar3) {
              ::std::__cxx11::string::append((string *)err);
              local_33c = false;
            }
            else {
              local_33c = (bool)(local_33c & bVar3);
            }
            bVar3 = (err == (string *)0x0 || bVar3) && bVar3;
          }
          else {
            Path::operator=(&local_1d0,&local_2a0);
            bVar3 = true;
            local_330 = pMVar1;
          }
          Path::~Path(&local_2a0);
          ::std::__cxx11::string::_M_dispose();
          if (!bVar3) goto LAB_0028c75d;
        }
        Path::get_parent_prim_path(&local_2a0,&local_100);
        Path::operator=(&local_100,&local_2a0);
        bVar3 = Path::is_root_prim(&local_100);
        Path::~Path(&local_2a0);
      } while (!bVar3);
      if (local_330 == (Material *)0x0) {
        bVar3 = true;
      }
      else {
        *local_2f8 = local_330;
        Path::operator=(local_300,&local_1d0);
        local_33c = true;
        bVar3 = false;
      }
LAB_0028c768:
      Path::~Path(&local_1d0);
      Path::~Path(&local_100);
      prim_00 = (Prim *)&(prim_00->_abs_path)._prop_part;
    } while (bVar3);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_318);
  }
  return local_33c;
}

Assistant:

bool GetBoundMaterial(
  const Stage &_stage,
  const Path &abs_path,
  const std::string &materialPurpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (materialPath == nullptr) {
    return false;
  }

  if (material == nullptr) {
    return false;
  }

  std::vector<value::token> purposes;
  if (materialPurpose.empty()) {
    purposes.push_back(value::token("")); // all-purpose
  } else {
    purposes.push_back(value::token(materialPurpose));
    purposes.push_back(value::token("")); // all-purpose
  }

  // for purpose : purposes:
  //
  //   boundMaterial = None
  //
  //   for p = prim, p != Root, p = p.GetParent():
  //
  //     if DirectBindingStrongerThanDescendants(p, purpose) or not boundMaterial:
  //
  //       if dicrectBind = GetDirectlyBoundMaterial(p, purpose):
  //
  //         boundMaterial = directBound
  //
  //     for collBinding : GetCollectionMaterialBindings(p, purpose):
  //
  //       if (collBinding.GetCollection().Contains(prim) and
  //           collBinding.IsStrongerThanDescendants() or not boundMaterial):
  //
  //         boundMaterial = collBinding.GetMaterial()
  //         break
  //
  //
  //   if boundMaterial:
  //     return boundMaterial
  //
  //
  // return False(or return default material)

  for (const auto &purpose : purposes) {

    Path currentPath = abs_path;
    Path boundMaterialPath;
    const Material *boundMaterial{nullptr};

    // We need to climb up to the root in any case.
    // TODO: Cache result.
    uint32_t depth = 0;
    while (depth < 1024*128) { // to avoid infinite loop.

      if (!currentPath.is_valid() || currentPath.is_root_path()) {
        break;
      }

      const Prim *prim{nullptr};
      bool ret = _stage.find_prim_at_path(currentPath, prim, err);
      if (!ret) {
        return false;
      }

      if (!boundMaterial || DirectBindingStrongerThanDescendants(_stage, *prim, purpose.str())) {

        std::string _err;
        Path directMaterialPath;
        const Material *directMaterial{nullptr};
        bool has_directBound = GetDirectlyBoundMaterial(_stage, *prim, purpose.str(), &directMaterialPath, &directMaterial, &_err);

        if (has_directBound && directMaterial) {

          boundMaterial = directMaterial;
          boundMaterialPath = directMaterialPath;
        
        } else if (_err.size()) {
          if (err) {
            (*err) += _err;
          }
          return false;
        }
      }

      Path parentPath = currentPath.get_parent_prim_path();
      DCOUT("search parent: " << parentPath.full_path_name());

      currentPath = parentPath;

      if (currentPath.is_root_prim()) {
        // parent is root('/'), so no need to follow the parent path anymore.
        break;
      }

      depth++;

      // TODO: collection
    }

    if (boundMaterial) {
      (*material) = boundMaterial;
      (*materialPath) = boundMaterialPath;
      return true;
    }
  }

  return false;
}